

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

void int_to_bytes_be(uchar *bytes,int value)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  undefined1 auVar5 [16];
  
  auVar5 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  value >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)value >> 0x10),value)) >>
                                                  0x20),value) >> 0x18),(char)((uint)value >> 8)),
                            (ushort)(byte)value) & 0xffffff00ffffff);
  auVar5 = pshuflw(auVar5,auVar5,0x1b);
  sVar1 = auVar5._0_2_;
  sVar2 = auVar5._2_2_;
  sVar3 = auVar5._4_2_;
  sVar4 = auVar5._6_2_;
  *(uint *)bytes =
       CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar5[6] - (0xff < sVar4),
                CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar5[4] - (0xff < sVar3),
                         CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar5[2] - (0xff < sVar2),
                                  (0 < sVar1) * (sVar1 < 0x100) * auVar5[0] - (0xff < sVar1))));
  return;
}

Assistant:

void int_to_bytes_be(unsigned char *bytes, int value)
{
	const unsigned char *pValue = (const unsigned char *)&value;
	for(unsigned i = 0; i < sizeof(int); i++)
	{
#if defined(CONF_ARCH_ENDIAN_BIG)
		bytes[i] = pValue[i];
#else
		bytes[sizeof(int) - i - 1] = pValue[i];
#endif
	}
}